

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O0

void __thiscall
QtMWidgets::NavigationButton::paintEvent(NavigationButton *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  NavigationButtonPrivate *pNVar7;
  QRect QVar8;
  QString local_e0;
  undefined1 local_c8 [8];
  QString t;
  QStyleOption opt;
  uint local_6c;
  int flags;
  int delta;
  int arrowHeight;
  int arrowWidth;
  QRect textRect;
  QRect arrowRect;
  QRect r;
  undefined1 local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  NavigationButton *this_local;
  
  _p = param_1;
  QPainter::QPainter((QPainter *)local_20,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)(QPainter *)local_20,true);
  QVar8 = QWidget::rect((QWidget *)this);
  arrowRect._8_8_ = QVar8._0_8_;
  QRect::QRect((QRect *)&textRect.x2);
  QRect::QRect((QRect *)&arrowHeight);
  iVar1 = FingerGeometry::width();
  iVar1 = qRound((double)iVar1 / 5.0);
  iVar2 = FingerGeometry::height();
  iVar2 = qRound((double)iVar2 / 3.0);
  iVar3 = QRect::height((QRect *)&arrowRect.x2);
  iVar3 = (iVar3 - iVar2) / 2;
  local_6c = 0x980;
  pNVar7 = QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
           ::operator->(&this->d);
  if (pNVar7->direction == Left) {
    iVar4 = QRect::width((QRect *)&arrowRect.x2);
    iVar5 = QRect::y((QRect *)&arrowRect.x2);
    QRect::setRect((QRect *)&textRect.x2,iVar4 - iVar1,iVar5 + iVar3,iVar1,iVar2);
    iVar2 = QRect::x((QRect *)&arrowRect.x2);
    iVar3 = QRect::y((QRect *)&arrowRect.x2);
    iVar4 = QRect::width((QRect *)&arrowRect.x2);
    iVar5 = QRect::height((QRect *)&arrowRect.x2);
    QRect::setRect((QRect *)&arrowHeight,iVar2 + iVar1 + 10,iVar3,(iVar4 - iVar1) + -10,iVar5);
    local_6c = 0x981;
  }
  else if (pNVar7->direction == Right) {
    iVar4 = QRect::x((QRect *)&arrowRect.x2);
    iVar5 = QRect::width((QRect *)&arrowRect.x2);
    iVar6 = QRect::y((QRect *)&arrowRect.x2);
    QRect::setRect((QRect *)&textRect.x2,(iVar4 + iVar5) - iVar1,iVar6 + iVar3,iVar1,iVar2);
    iVar2 = QRect::x((QRect *)&arrowRect.x2);
    iVar3 = QRect::y((QRect *)&arrowRect.x2);
    iVar4 = QRect::width((QRect *)&arrowRect.x2);
    iVar5 = QRect::height((QRect *)&arrowRect.x2);
    QRect::setRect((QRect *)&arrowHeight,iVar2,iVar3,(iVar4 - iVar1) + -10,iVar5);
    local_6c = 0x982;
  }
  QStyleOption::QStyleOption((QStyleOption *)&t.d.size,1,0);
  QStyleOption::initFrom((QWidget *)&t.d.size);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
           ::operator->(&this->d);
  QAbstractButton::text();
  NavigationButtonPrivate::makeString
            ((QString *)local_c8,pNVar7,&local_e0,(QRect *)&arrowHeight,local_6c,
             (QStyleOption *)&t.d.size);
  QString::~QString(&local_e0);
  QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
  ::operator->(&this->d);
  QPainter::setPen((QColor *)local_20);
  QPainter::drawText((QRect *)local_20,(int)&arrowHeight,(QString *)(ulong)local_6c,
                     (QRect *)local_c8);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
           ::operator->(&this->d);
  if (pNVar7->direction == Left) {
    QPainter::rotate(180.0);
    iVar1 = QRect::width((QRect *)&arrowRect.x2);
    iVar2 = QRect::height((QRect *)&arrowRect.x2);
    QPainter::translate((QPainter *)local_20,(double)-iVar1,(double)-iVar2);
  }
  pNVar7 = QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
           ::operator->(&this->d);
  drawArrow((QPainter *)local_20,(QRect *)&textRect.x2,&pNVar7->color);
  QString::~QString((QString *)local_c8);
  QStyleOption::~QStyleOption((QStyleOption *)&t.d.size);
  QPainter::~QPainter((QPainter *)local_20);
  return;
}

Assistant:

void
NavigationButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();
	QRect arrowRect;
	QRect textRect;

	const int arrowWidth = qRound( (qreal) FingerGeometry::width() / 5.0 );
	const int arrowHeight = qRound( (qreal) FingerGeometry::height() / 3.0 );
	const int delta = ( r.height() - arrowHeight ) /2;

	int flags = Qt::TextSingleLine | Qt::TextShowMnemonic | Qt::AlignVCenter;

	switch( d->direction )
	{
		case Left :
		{
			arrowRect.setRect( r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x() + arrowWidth + c_offset, r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignLeft;
		}
			break;

		case Right :
		{
			arrowRect.setRect( r.x() + r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x(), r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignRight;
		}
			break;

		default :
			break;
	}

	QStyleOption opt;
	opt.initFrom( this );

	const QString t = d->makeString( text(), textRect, flags, opt );

	p.setPen( d->textColor );
	p.drawText( textRect, flags, t );

	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );
	}

	drawArrow( &p, arrowRect, d->color );
}